

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_precall(lua_State *L,StkId func,int nresults,int op_call)

{
  uint uVar1;
  Instruction **ppIVar2;
  byte bVar3;
  byte bVar4;
  GCObject *pGVar5;
  lua_CFunction p_Var6;
  int *piVar7;
  Proto *p;
  Instruction *pIVar8;
  CallInfo *pCVar9;
  char cVar10;
  short sVar11;
  ushort uVar12;
  uint uVar13;
  int nres;
  int iVar14;
  TValue *pTVar15;
  CallInfo *pCVar16;
  lua_State *plVar17;
  StkId pTVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  StkId pTVar22;
  TValue *io1;
  bool bVar23;
  lua_Number __x;
  undefined1 auVar24 [16];
  undefined1 in_ZMM1 [64];
  ravi_compile_options_t local_38;
  
  uVar13 = (uint)func->tt_;
  plVar17 = L;
  do {
    auVar24 = in_ZMM1._0_16_;
    uVar1 = (uVar13 & 0x7f) - 6;
    sVar11 = (short)uVar13;
    switch(uVar1 >> 4 | uVar1 * 0x10000000) {
    case 0:
      if (sVar11 != -0x7ffa) {
        pcVar21 = "((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_0011349d:
        __assert_fail(pcVar21,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1cd,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      if ((func->value_).f[8] != (_func_int_lua_State_ptr)0x6) {
        pcVar21 = "(((func)->value_).gc)->tt == ((6) | ((0) << 4))";
        goto LAB_0011349d;
      }
      p = *(Proto **)((func->value_).f + 0x18);
      bVar3 = p->maxstacksize;
      uVar20 = (long)L->top - (long)func;
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)bVar3) {
        pTVar18 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,(uint)bVar3);
        func = (StkId)(((long)func - (long)pTVar18) + (long)L->stack);
      }
      uVar13 = (int)(uVar20 >> 4) - 1;
      bVar4 = p->numparams;
      if (p->is_vararg == '\0') {
        for (; (int)uVar13 < (int)(uint)bVar4; uVar13 = uVar13 + 1) {
          pTVar18 = L->top;
          L->top = pTVar18 + 1;
          pTVar18->tt_ = 0;
        }
        pTVar18 = func + 1;
      }
      else {
        lVar19 = (long)(int)uVar13;
        pTVar18 = L->top;
        uVar13 = ~((int)uVar13 >> 0x1f) & uVar13;
        if ((int)(uint)bVar4 <= (int)uVar13) {
          uVar13 = (uint)bVar4;
        }
        for (uVar20 = 0; uVar13 << 4 != uVar20; uVar20 = uVar20 + 0x10) {
          pTVar22 = L->top;
          L->top = pTVar22 + 1;
          pGVar5 = *(GCObject **)((long)&pTVar18[-lVar19].value_ + uVar20);
          (pTVar22->value_).gc = pGVar5;
          uVar12 = *(ushort *)((long)&pTVar18[-lVar19].tt_ + uVar20);
          pTVar22->tt_ = uVar12;
          if (((short)uVar12 < 0) &&
             (((uVar12 & 0x7f) != (ushort)pGVar5->tt ||
              ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x13d,"StkId adjust_varargs(lua_State *, Proto *, int)");
          }
          *(undefined2 *)((long)&pTVar18[-lVar19].tt_ + uVar20) = 0;
        }
        iVar14 = bVar4 - uVar13;
        while (bVar23 = iVar14 != 0, iVar14 = iVar14 + -1, bVar23) {
          pTVar22 = L->top;
          L->top = pTVar22 + 1;
          pTVar22->tt_ = 0;
        }
      }
      pCVar16 = L->ci->next;
      if (pCVar16 == (CallInfo *)0x0) {
        pCVar16 = luaE_extendCI(L);
      }
      L->ci = pCVar16;
      pTVar22 = pTVar18 + bVar3;
      pCVar16->nresults = (short)nresults;
      pCVar16->func = func;
      (pCVar16->u).l.base = pTVar18;
      pCVar16->top = pTVar22;
      L->top = pTVar22;
      if (L->stack_last < pTVar22) {
        __assert_fail("ci->top <= L->stack_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1dd,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      pIVar8 = p->code;
      (pCVar16->u).l.savedpc = pIVar8;
      pCVar16->callstatus = 2;
      pCVar16->jitstatus = '\0';
      if ((L->hookmask & 1) != 0) {
        iVar14 = 0;
        (pCVar16->u).l.savedpc = pIVar8 + 1;
        pCVar9 = pCVar16->previous;
        if ((((pCVar9->callstatus & 2) != 0) && (pCVar9->jitstatus == '\0')) &&
           (*(char *)((pCVar9->u).c.old_errfunc + -4) == '%')) {
          pCVar16->callstatus = 0x22;
          iVar14 = 4;
        }
        luaD_hook(L,iVar14,-1);
        ppIVar2 = &(pCVar16->u).l.savedpc;
        *ppIVar2 = *ppIVar2 + -1;
      }
      plVar17 = L->l_G->mainthread;
      if (plVar17 == L) {
        if ((p->ravi_jit).jit_status == '\0') {
          local_38 = (ravi_compile_options_t)0x0;
          raviV_compile(L,p,&local_38);
          plVar17 = L->l_G->mainthread;
          goto LAB_001131db;
        }
      }
      else {
LAB_001131db:
        if (plVar17 != L) {
          return 0;
        }
      }
      if ((p->ravi_jit).jit_function == (lua_CFunction)0x0) {
        return 0;
      }
      pCVar16->jitstatus = '\x01';
      ppIVar2 = &(pCVar16->u).l.savedpc;
      *ppIVar2 = *ppIVar2 + 1;
      uVar12 = L->nCcalls + 1;
      L->nCcalls = uVar12;
      if (0x7c < uVar12) {
        if (uVar12 == 0x7d) {
          pcVar21 = "stack overflow";
LAB_001133c0:
          luaG_runerror(L,pcVar21);
        }
        if (0x8b < uVar12) {
          luaD_throw(L,6);
        }
      }
      L->nny = L->nny + 1;
      iVar14 = (*(p->ravi_jit).jit_function)(L);
      uVar13._0_2_ = L->nny;
      uVar13._2_2_ = L->nCcalls;
      auVar24 = vpcmpeqd_avx(auVar24,auVar24);
      auVar24 = vpaddw_avx(ZEXT416(uVar13),auVar24);
      L->nny = (short)auVar24._0_4_;
      L->nCcalls = (short)((uint)auVar24._0_4_ >> 0x10);
      if (op_call == 0) {
        return 2;
      }
      if (iVar14 != 0) {
        if ((L->ci->callstatus & 2) == 0) {
          __assert_fail("((L->ci)->callstatus & (1<<1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x205,"int luaD_precall(lua_State *, StkId, int, int)");
        }
        L->top = L->ci->top;
        return 2;
      }
      return 2;
    case 1:
      pTVar18 = func;
      if (sVar11 != 0x16) {
        __assert_fail("((((func))->tt_) == (((6) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1b7,"int luaD_precall(lua_State *, StkId, int, int)");
      }
LAB_00112f0d:
      p_Var6 = (pTVar18->value_).f;
      if ((long)L->stack_last - (long)L->top < 0x150) {
        pTVar18 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,0x14);
        func = (StkId)(((long)func - (long)pTVar18) + (long)L->stack);
      }
      pCVar16 = L->ci->next;
      if (pCVar16 == (CallInfo *)0x0) {
        pCVar16 = luaE_extendCI(L);
      }
      L->ci = pCVar16;
      pCVar16->nresults = (short)nresults;
      pCVar16->func = func;
      pTVar18 = L->top;
      pCVar16->top = pTVar18 + 0x14;
      if (L->stack_last < pTVar18 + 0x14) {
        __assert_fail("ci->top <= L->stack_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1bf,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      pCVar16->callstatus = 0;
      pCVar16->jitstatus = '\0';
      if ((L->hookmask & 1) != 0) {
        luaD_hook(L,0,-1);
      }
      piVar7 = *(int **)&L[-1].hookmask;
      *piVar7 = *piVar7 + -1;
      if (*piVar7 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c4,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      nres = (*p_Var6)(L);
      iVar14 = **(int **)&L[-1].hookmask;
      **(int **)&L[-1].hookmask = iVar14 + 1;
      if (iVar14 != 0) {
        __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c6,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      if ((long)L->top - (long)L->ci->func >> 4 <= (long)nres) {
        __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c7,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      luaD_poscall(L,pCVar16,L->top + -(long)nres,nres);
      return 1;
    case 2:
      if (sVar11 == -0x7fda) {
        if ((func->value_).f[8] == (_func_int_lua_State_ptr)0x26) {
          pTVar18 = (StkId)((func->value_).f + 0x18);
          goto LAB_00112f0d;
        }
        pcVar21 = "(((func)->value_).gc)->tt == ((6) | ((2) << 4))";
      }
      else {
        pcVar21 = "((((func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
      }
      __assert_fail(pcVar21,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1b4,"int luaD_precall(lua_State *, StkId, int, int)");
    default:
      if ((long)L->stack_last - (long)L->top < 0x11) {
        pTVar18 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,1);
        func = (StkId)(((long)func - (long)pTVar18) + (long)L->stack);
      }
      plVar17 = L;
      pTVar15 = luaT_gettmbyobj(L,func,TM_CALL);
      if ((pTVar15->tt_ & 0xf) != 6) {
        luaG_typeerror(L,func,"call");
      }
      for (pTVar18 = L->top; func < pTVar18; pTVar18 = pTVar18 + -1) {
        pGVar5 = pTVar18[-1].value_.gc;
        (pTVar18->value_).gc = pGVar5;
        uVar12 = pTVar18[-1].tt_;
        pTVar18->tt_ = uVar12;
        if (((short)uVar12 < 0) &&
           ((plVar17 = (lua_State *)(ulong)pGVar5->tt, (uVar12 & 0x7f) != (ushort)pGVar5->tt ||
            ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x152,"void tryfuncTM(lua_State *, StkId)");
        }
      }
      L->top = L->top + 1;
      pGVar5 = (pTVar15->value_).gc;
      (func->value_).gc = pGVar5;
      uVar12 = pTVar15->tt_;
      uVar13 = (uint)uVar12;
      func->tt_ = uVar12;
      if (((short)uVar12 < 0) &&
         (((uVar12 & 0x7f) != (ushort)pGVar5->tt ||
          ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x154,"void tryfuncTM(lua_State *, StkId)");
      }
      break;
    case 4:
      cVar10 = (char)(uVar13 >> 8);
      if (((byte)(cVar10 - 1U) < 3) && (((long)L->top - (long)func & 0xffffffff0U) == 0x20)) {
        pTVar18 = func + 1;
        if (func[1].tt_ == 0x13) {
          __x = (lua_Number)(pTVar18->value_).i;
LAB_00113257:
          if (cVar10 == '\x02') {
            __x = log(__x);
          }
          else if (uVar13 >> 8 == 1) {
            __x = exp(__x);
          }
          else {
            if ((short)(uVar13 & 0x7f) != 0x46) {
              __assert_fail("((((func)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x229,"int luaD_precall(lua_State *, StkId, int, int)");
            }
            (*(func->value_).f)(plVar17);
          }
          (func->value_).n = __x;
          func->tt_ = 3;
          L->top = pTVar18;
          return 1;
        }
        if (func[1].tt_ == 3) {
          __x = (pTVar18->value_).n;
          goto LAB_00113257;
        }
      }
      pcVar21 = "Unsupported fastcall to C function";
      goto LAB_001133c0;
    }
  } while( true );
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults, int op_call) {
  lua_CFunction f;
  CallInfo *ci;
  switch (ttype(func)) {
    case LUA_TCCL:  /* C closure */
      f = clCvalue(func)->f;
      goto Cfunc;
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
     Cfunc: {
      int n;  /* number of returns */
      checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, ci, L->top - n, n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      int n = cast_int(L->top - func) - 1;  /* number of real arguments */
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      if (p->is_vararg)
        base = adjust_varargs(L, p, n);
      else {  /* non vararg function */
        for (; n < p->numparams; n++)
          setnilvalue(L->top++);  /* complete missing arguments */
        base = func + 1;
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      L->top = ci->top = base + fsize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      if (L == G(L)->mainthread && p->ravi_jit.jit_status == RAVI_JIT_NOT_COMPILED) {
        /* not compiled */
        ravi_compile_options_t options;
        memset(&options, 0, sizeof options);
        raviV_compile(L, p, &options);
      }
      if (L == G(L)->mainthread && p->ravi_jit.jit_function) {
        /* compiled */
        ci->jitstatus = 1;
        /* Since the JITed function does not update savedpc
         * other than for calls by default - the stack trace error
         * message below will be unable to find the line info
         * as savedpc is not set correctly - so we set this here
         * prior to the call
         */
        ci->u.l.savedpc++;
        /* As JITed function is like a C function
         * employ the same restrictions on recursive
         * calls as for C functions
         */
        if (++L->nCcalls >= LUAI_MAXCCALLS) {
          if (L->nCcalls == LUAI_MAXCCALLS)
            luaG_runerror(L, "stack overflow");
          else if (L->nCcalls >= (LUAI_MAXCCALLS + (LUAI_MAXCCALLS >> 3)))
            luaD_throw(L, LUA_ERRERR); /* error while handing stack error */
        }
        /* Disable YIELDs - so JITed functions cannot
         * yield
         */
        L->nny++;
        int b = (*p->ravi_jit.jit_function)(L);
        L->nny--;
        L->nCcalls--;
        if (op_call && b) {
          lua_assert(isLua(L->ci));
          /* b is the value returned by luaD_poscall()
           */
          L->top = L->ci->top;
        }
        /* Return a different value from 1 to
         * allow luaV_execute() to distinguish between
         * JITed function and true C function
         */
        return 2;
      }
      return 0;
    }
    case RAVI_TFCF: {
      int nargs = (int)(L->top - func - 1);
      int tt = rttype(func);
      int sig = getfcf_tag(tt); /* Extract the function signature */
      switch (sig) {
        case RAVI_TFCF_LOG:
        case RAVI_TFCF_EXP:
        case RAVI_TFCF_D_D: {
          if (nargs == 1) {
            TValue *arg1 = func + 1;
            double arg;
            if (ttisfloat(arg1))
              arg = fltvalue(arg1);
            else if (ttisinteger(arg1))
              arg = (double)ivalue(arg1);
            else
              nargs = 0;
            if (nargs) {
              double v;
              switch (sig) {
                case RAVI_TFCF_EXP: v = exp(arg); break;
                case RAVI_TFCF_LOG: v = log(arg); break;
                default: {
                  double(*f)(double) = fcfvalue(func);
                  v = f(arg);
                  break;
                }
              }
              setfltvalue(func, v);
              L->top = func + 1; /* top points after the last result */
              return 1;
            }
          }
          break;
        }
        default: { break; }
      }
      luaG_runerror(L, "Unsupported fastcall to C function");
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* ensure space for metamethod */
      tryfuncTM(L, func);  /* try to get '__call' metamethod */
      return luaD_precall(L, func, nresults, op_call);  /* now it must be a function */
    }
  }
}